

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O3

unsigned_long
spvtools::utils::SignExtendValue<unsigned_long>(unsigned_long value,uint32_t number_of_bits)

{
  ulong num_bits_to_mutate;
  unsigned_long uVar1;
  
  if (number_of_bits == 0x40) {
    return value;
  }
  if (0x3f < number_of_bits - 1) {
    __assert_fail("position < IntegerBitWidth<T>::get && \"position must be less than the bit width\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/bitutils.h"
                  ,0x74,"bool spvtools::utils::IsBitAtPositionSet(T, size_t) [T = unsigned long]");
  }
  num_bits_to_mutate = (ulong)(0x40 - number_of_bits);
  if ((value >> ((ulong)(number_of_bits - 1) & 0x3f) & 1) == 0) {
    uVar1 = ClearHighBits<unsigned_long>(value,num_bits_to_mutate);
    return uVar1;
  }
  if (num_bits_to_mutate != 0) {
    if (num_bits_to_mutate < 0x41) {
      uVar1 = MutateBits<unsigned_long>(value,0x40 - num_bits_to_mutate,num_bits_to_mutate,true);
      return uVar1;
    }
    __assert_fail("num_bits_to_set <= word_bit_width && \"Can\'t set more bits than bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/bitutils.h"
                  ,0xa5,"T spvtools::utils::SetHighBits(T, size_t) [T = unsigned long]");
  }
  return value;
}

Assistant:

T SignExtendValue(T value, uint32_t number_of_bits) {
  const uint32_t bit_width = sizeof(value) * 8;
  if (number_of_bits == bit_width) return value;

  bool is_negative = utils::IsBitAtPositionSet(value, number_of_bits - 1);
  if (is_negative) {
    value = utils::SetHighBits(value, bit_width - number_of_bits);
  } else {
    value = utils::ClearHighBits(value, bit_width - number_of_bits);
  }
  return value;
}